

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

double try_to_double(string *s)

{
  char *pcVar1;
  double dVar2;
  
  if (((2 < s->_M_string_length) && (pcVar1 = (s->_M_dataplus)._M_p, *pcVar1 == '0')) &&
     ((byte)(pcVar1[1] | 0x20U) == 0x78)) {
    dVar2 = (double)std::__cxx11::stoull(s,(size_t *)0x0,0x10);
    return dVar2;
  }
  dVar2 = std::__cxx11::stod(s,(size_t *)0x0);
  return dVar2;
}

Assistant:

inline double try_to_double(std::string s) {
    if (s.length() > 2 && s[0] == '0' && (s[1] == 'x' || s[1] == 'X')) {
        union {
            double d;
            std::uint64_t ll;
        } v;
        v.ll = static_cast<std::uint64_t>(std::stoull(s, 0, 16));
        return v.d;
    }
    else {
        return std::stod(s, 0);
    }
}